

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O1

ScalarFunctionSet * duckdb::OperatorMultiplyFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_true> *this;
  PhysicalType PVar1;
  pointer pSVar2;
  LogicalType varargs;
  LogicalType varargs_00;
  LogicalType varargs_01;
  LogicalType varargs_02;
  LogicalType varargs_03;
  bool bVar3;
  NotImplementedException *this_00;
  PhysicalType type;
  ScalarFunction *func;
  long lVar4;
  pointer function_00;
  undefined8 *puVar5;
  ScalarFunctionSet *in_RDI;
  bind_scalar_function_t *pp_Var6;
  pointer other;
  byte bVar7;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  initializer_list<duckdb::LogicalType> __l_01;
  initializer_list<duckdb::LogicalType> __l_02;
  initializer_list<duckdb::LogicalType> __l_03;
  ScalarFunction function;
  undefined4 in_stack_fffffffffffff524;
  undefined4 in_stack_fffffffffffff52c;
  FunctionNullHandling in_stack_fffffffffffff538;
  allocator_type local_ac1;
  undefined1 local_ab8 [24];
  LogicalType local_aa0;
  _Any_data local_a88;
  code *local_a78;
  undefined8 uStack_a70;
  vector<duckdb::ScalarFunction,_true> *local_a68;
  _Any_data *local_a60;
  scalar_function_t local_a58;
  scalar_function_t local_a38;
  _Any_data *local_a18;
  _Any_data *local_a10;
  bind_scalar_function_t *local_a08;
  undefined8 *local_a00;
  _func_int **local_9f8;
  LogicalType *local_9f0;
  LogicalType *local_9e8;
  LogicalType *local_9e0;
  _Any_data local_9d8;
  code *local_9c8;
  undefined8 uStack_9c0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_9b0;
  _Any_data local_998;
  code *local_988;
  LogicalType local_978;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_960;
  LogicalType local_948;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_930;
  LogicalType local_918;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_900;
  LogicalType local_8e8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_8d0;
  LogicalType local_8b8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_8a0;
  LogicalType local_888;
  LogicalType local_870;
  LogicalType local_858;
  LogicalType local_840;
  string local_828;
  string local_808;
  undefined1 local_7e8 [144];
  LogicalType LStack_758;
  FunctionStability local_740;
  FunctionNullHandling FStack_73f;
  FunctionErrors FStack_73e;
  FunctionCollationHandling FStack_73d;
  _Any_data _Stack_738;
  _Manager_type local_728;
  undefined8 auStack_718 [7];
  code *local_6e0;
  code *local_6d8;
  element_type *local_6d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_6c8;
  LogicalType local_6c0;
  ScalarFunction local_6a8;
  ScalarFunction local_580;
  ScalarFunction local_458;
  ScalarFunction local_330;
  ScalarFunction local_208;
  BaseScalarFunction local_e0;
  
  bVar7 = 0;
  local_828._M_dataplus._M_p = (pointer)&local_828.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_828,anon_var_dwarf_63fca92 + 8,anon_var_dwarf_63fca92 + 9);
  ScalarFunctionSet::ScalarFunctionSet(in_RDI,&local_828);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_828._M_dataplus._M_p != &local_828.field_2) {
    operator_delete(local_828._M_dataplus._M_p);
  }
  LogicalType::Numeric();
  local_9e0 = local_9b0.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_finish;
  if (local_9b0.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_9b0.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_a18 = (_Any_data *)&local_330.function;
    local_a10 = (_Any_data *)&local_208.function;
    local_9f0 = &local_6a8.super_BaseScalarFunction.return_type;
    local_9e8 = &LStack_758;
    local_a60 = (_Any_data *)&local_6a8.function;
    local_a08 = &local_6a8.bind;
    local_a00 = auStack_718;
    local_9f8 = (_func_int **)&PTR__BaseScalarFunction_0247c9f0;
    local_a68 = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
    other = local_9b0.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            _M_impl.super__Vector_impl_data._M_start;
    do {
      if (other->id_ == DECIMAL) {
        LogicalType::LogicalType((LogicalType *)local_ab8,other);
        LogicalType::LogicalType((LogicalType *)(local_ab8 + 0x18),other);
        __l._M_len = 2;
        __l._M_array = (iterator)local_ab8;
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  (&local_8a0,__l,(allocator_type *)&local_808);
        LogicalType::LogicalType(&local_8b8,other);
        local_9c8 = (code *)0x0;
        uStack_9c0 = 0;
        local_9d8._M_unused._M_object = (void *)0x0;
        local_9d8._8_8_ = 0;
        LogicalType::LogicalType(&local_6c0,INVALID);
        varargs.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
        varargs._0_8_ = &local_6c0;
        varargs.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
             in_stack_fffffffffffff524;
        varargs.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_4_ = 0;
        varargs.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ = in_stack_fffffffffffff52c;
        ScalarFunction::ScalarFunction
                  ((ScalarFunction *)local_7e8,(vector<duckdb::LogicalType,_true> *)&local_8a0,
                   &local_8b8,(scalar_function_t *)&local_9d8,BindDecimalMultiply,
                   (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
                   (init_local_state_t)0x0,varargs,CONSISTENT,in_stack_fffffffffffff538,
                   (bind_lambda_function_t)in_RDI);
        LogicalType::~LogicalType(&local_6c0);
        if (local_9c8 != (code *)0x0) {
          (*local_9c8)(&local_9d8,&local_9d8,__destroy_functor);
        }
        LogicalType::~LogicalType(&local_8b8);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  (&local_8a0);
        lVar4 = 0x18;
        do {
          LogicalType::~LogicalType((LogicalType *)(local_ab8 + lVar4));
          lVar4 = lVar4 + -0x18;
        } while (lVar4 != -0x18);
        local_6e0 = SerializeDecimalArithmetic;
        local_6d8 = 
        DeserializeDecimalArithmetic<duckdb::MultiplyOperator,duckdb::DecimalMultiplyOverflowCheck,false>
        ;
        SimpleFunction::SimpleFunction((SimpleFunction *)&local_6a8,(SimpleFunction *)local_7e8);
        local_6a8.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
             local_9f8;
        LogicalType::LogicalType(local_9f0,local_9e8);
        local_6a8.super_BaseScalarFunction.stability = local_740;
        local_6a8.super_BaseScalarFunction.null_handling = FStack_73f;
        local_6a8.super_BaseScalarFunction.errors = FStack_73e;
        local_6a8.super_BaseScalarFunction.collation_handling = FStack_73d;
        local_6a8.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
             (_func_int **)&PTR__ScalarFunction_0247c280;
        ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
        function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                  *)local_a60,
                 (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                  *)&_Stack_738);
        puVar5 = local_a00;
        pp_Var6 = local_a08;
        for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
          *pp_Var6 = (bind_scalar_function_t)*puVar5;
          puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
          pp_Var6 = pp_Var6 + (ulong)bVar7 * -2 + 1;
        }
        local_6a8.function_info.internal.
        super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             local_6d0;
        local_6a8.function_info.internal.
        super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = local_6c8._M_pi;
        if (local_6c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_6c8._M_pi)->_M_use_count = (local_6c8._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_6c8._M_pi)->_M_use_count = (local_6c8._M_pi)->_M_use_count + 1;
          }
        }
        ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
        emplace_back<duckdb::ScalarFunction>
                  (&local_a68->
                    super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
                   &local_6a8);
        local_6a8.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
             (_func_int **)&PTR__ScalarFunction_0247c280;
        if (local_6a8.function_info.internal.
            super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_6a8.function_info.internal.
                     super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_6a8.function.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*local_6a8.function.super__Function_base._M_manager)
                    (local_a60,local_a60,__destroy_functor);
        }
        BaseScalarFunction::~BaseScalarFunction(&local_6a8.super_BaseScalarFunction);
        local_7e8._0_8_ = &PTR__ScalarFunction_0247c280;
        if (local_6c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_6c8._M_pi);
        }
        if (local_728 != (_Manager_type)0x0) {
          (*local_728)(&_Stack_738,&_Stack_738,__destroy_functor);
        }
        BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_7e8);
      }
      else {
        bVar3 = TypeIsIntegral(other->physical_type_);
        if (bVar3) {
          LogicalType::LogicalType((LogicalType *)local_7e8,other);
          LogicalType::LogicalType((LogicalType *)(local_7e8 + 0x18),other);
          __l_00._M_len = 2;
          __l_00._M_array = (iterator)local_7e8;
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                    (&local_8d0,__l_00,&local_ac1);
          LogicalType::LogicalType(&local_8e8,other);
          PVar1 = other->physical_type_;
          local_a88._M_unused._M_object = (void *)0x0;
          local_a88._8_8_ = 0;
          local_a78 = (code *)0x0;
          uStack_a70 = 0;
          switch(PVar1) {
          case UINT8:
            local_ab8._0_8_ =
                 ScalarFunction::
                 BinaryFunction<unsigned_char,unsigned_char,unsigned_char,duckdb::MultiplyOperatorOverflowCheck>
            ;
            break;
          case INT8:
            local_ab8._0_8_ =
                 ScalarFunction::
                 BinaryFunction<signed_char,signed_char,signed_char,duckdb::MultiplyOperatorOverflowCheck>
            ;
            break;
          case UINT16:
            local_ab8._0_8_ =
                 ScalarFunction::
                 BinaryFunction<unsigned_short,unsigned_short,unsigned_short,duckdb::MultiplyOperatorOverflowCheck>
            ;
            break;
          case INT16:
            local_ab8._0_8_ =
                 ScalarFunction::
                 BinaryFunction<short,short,short,duckdb::MultiplyOperatorOverflowCheck>;
            break;
          case UINT32:
            local_ab8._0_8_ =
                 ScalarFunction::
                 BinaryFunction<unsigned_int,unsigned_int,unsigned_int,duckdb::MultiplyOperatorOverflowCheck>
            ;
            break;
          case INT32:
            local_ab8._0_8_ =
                 ScalarFunction::BinaryFunction<int,int,int,duckdb::MultiplyOperatorOverflowCheck>;
            break;
          case UINT64:
            local_ab8._0_8_ =
                 ScalarFunction::
                 BinaryFunction<unsigned_long,unsigned_long,unsigned_long,duckdb::MultiplyOperatorOverflowCheck>
            ;
            break;
          case INT64:
            local_ab8._0_8_ =
                 ScalarFunction::
                 BinaryFunction<long,long,long,duckdb::MultiplyOperatorOverflowCheck>;
            break;
          default:
            if (PVar1 == UINT128) {
              local_ab8._0_8_ =
                   ScalarFunction::
                   BinaryFunction<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::MultiplyOperatorOverflowCheck>
              ;
            }
            else {
              if (PVar1 != INT128) {
                this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
                local_ab8._0_8_ = local_ab8 + 0x10;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_ab8,"Unimplemented type for GetScalarBinaryFunction: %s",
                           "");
                TypeIdToString_abi_cxx11_(&local_808,(duckdb *)(ulong)PVar1,type);
                NotImplementedException::NotImplementedException<std::__cxx11::string>
                          (this_00,(string *)local_ab8,&local_808);
                __cxa_throw(this_00,&NotImplementedException::typeinfo,
                            ::std::runtime_error::~runtime_error);
              }
              local_ab8._0_8_ =
                   ScalarFunction::
                   BinaryFunction<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::MultiplyOperatorOverflowCheck>
              ;
            }
          }
          ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
          operator=((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
                    local_a88._M_pod_data,
                    (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr **)local_ab8);
          LogicalType::LogicalType(&local_840,INVALID);
          varargs_01.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
          varargs_01._0_8_ = &local_840;
          varargs_01.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
               in_stack_fffffffffffff524;
          varargs_01.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _0_4_ = 0;
          varargs_01.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _4_4_ = in_stack_fffffffffffff52c;
          ScalarFunction::ScalarFunction
                    (&local_208,(vector<duckdb::LogicalType,_true> *)&local_8d0,&local_8e8,
                     (scalar_function_t *)&local_a88,(bind_scalar_function_t)0x0,
                     (bind_scalar_function_extended_t)0x0,
                     PropagateNumericStats<duckdb::TryMultiplyOperator,duckdb::MultiplyPropagateStatistics,duckdb::MultiplyOperator>
                     ,(init_local_state_t)0x0,varargs_01,CONSISTENT,in_stack_fffffffffffff538,
                     (bind_lambda_function_t)in_RDI);
          ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
          emplace_back<duckdb::ScalarFunction>
                    (&local_a68->
                      super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
                     &local_208);
          local_208.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
               (_func_int **)&PTR__ScalarFunction_0247c280;
          if (local_208.function_info.internal.
              super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_208.function_info.internal.
                       super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_208.function.super__Function_base._M_manager != (_Manager_type)0x0) {
            (*local_208.function.super__Function_base._M_manager)
                      (local_a10,local_a10,__destroy_functor);
          }
          BaseScalarFunction::~BaseScalarFunction(&local_208.super_BaseScalarFunction);
          LogicalType::~LogicalType(&local_840);
          if (local_a78 != (code *)0x0) {
            (*local_a78)(&local_a88,&local_a88,__destroy_functor);
          }
          LogicalType::~LogicalType(&local_8e8);
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                    (&local_8d0);
          lVar4 = 0x18;
          do {
            LogicalType::~LogicalType((LogicalType *)(local_7e8 + lVar4));
            lVar4 = lVar4 + -0x18;
          } while (lVar4 != -0x18);
        }
        else {
          LogicalType::LogicalType((LogicalType *)local_7e8,other);
          LogicalType::LogicalType((LogicalType *)(local_7e8 + 0x18),other);
          __l_01._M_len = 2;
          __l_01._M_array = (iterator)local_7e8;
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                    (&local_900,__l_01,(allocator_type *)local_ab8);
          LogicalType::LogicalType(&local_918,other);
          GetScalarBinaryFunction<duckdb::MultiplyOperator>
                    ((scalar_function_t *)&local_998,other->physical_type_);
          LogicalType::LogicalType(&local_858,INVALID);
          varargs_00.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
          varargs_00._0_8_ = &local_858;
          varargs_00.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
               in_stack_fffffffffffff524;
          varargs_00.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _0_4_ = 0;
          varargs_00.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _4_4_ = in_stack_fffffffffffff52c;
          ScalarFunction::ScalarFunction
                    (&local_330,(vector<duckdb::LogicalType,_true> *)&local_900,&local_918,
                     (scalar_function_t *)&local_998,(bind_scalar_function_t)0x0,
                     (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
                     (init_local_state_t)0x0,varargs_00,CONSISTENT,in_stack_fffffffffffff538,
                     (bind_lambda_function_t)in_RDI);
          ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
          emplace_back<duckdb::ScalarFunction>
                    (&local_a68->
                      super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
                     &local_330);
          local_330.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
               (_func_int **)&PTR__ScalarFunction_0247c280;
          if (local_330.function_info.internal.
              super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_330.function_info.internal.
                       super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_330.function.super__Function_base._M_manager != (_Manager_type)0x0) {
            (*local_330.function.super__Function_base._M_manager)
                      (local_a18,local_a18,__destroy_functor);
          }
          BaseScalarFunction::~BaseScalarFunction(&local_330.super_BaseScalarFunction);
          LogicalType::~LogicalType(&local_858);
          if (local_988 != (code *)0x0) {
            (*local_988)(&local_998,&local_998,__destroy_functor);
          }
          LogicalType::~LogicalType(&local_918);
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                    (&local_900);
          lVar4 = 0x18;
          do {
            LogicalType::~LogicalType((LogicalType *)(local_7e8 + lVar4));
            lVar4 = lVar4 + -0x18;
          } while (lVar4 != -0x18);
        }
      }
      other = other + 1;
    } while (other != local_9e0);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_9b0);
  LogicalType::LogicalType((LogicalType *)local_7e8,INTERVAL);
  LogicalType::LogicalType((LogicalType *)(local_7e8 + 0x18),DOUBLE);
  __l_02._M_len = 2;
  __l_02._M_array = (LogicalType *)local_7e8;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_930,__l_02,(allocator_type *)local_ab8);
  LogicalType::LogicalType(&local_948,INTERVAL);
  local_a38.super__Function_base._M_functor._8_8_ = 0;
  local_a38.super__Function_base._M_functor._M_unused._M_function_pointer =
       ScalarFunction::
       BinaryFunction<duckdb::interval_t,double,duckdb::interval_t,duckdb::MultiplyOperator>;
  local_a38._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_a38.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_870,INVALID);
  varargs_02.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_02._0_8_ = &local_870;
  varargs_02.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffff524;
  varargs_02.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_02.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffff52c;
  ScalarFunction::ScalarFunction
            (&local_458,(vector<duckdb::LogicalType,_true> *)&local_930,&local_948,&local_a38,
             (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,(init_local_state_t)0x0,varargs_02,CONSISTENT,
             in_stack_fffffffffffff538,(bind_lambda_function_t)in_RDI);
  this = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_458);
  local_458.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_0247c280;
  if (local_458.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_458.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_458.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_458.function.super__Function_base._M_manager)
              ((_Any_data *)&local_458.function,(_Any_data *)&local_458.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_458.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_870);
  if (local_a38.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_a38.super__Function_base._M_manager)
              ((_Any_data *)&local_a38,(_Any_data *)&local_a38,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_948);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_930);
  lVar4 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(local_7e8 + lVar4));
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  LogicalType::LogicalType((LogicalType *)local_7e8,BIGINT);
  LogicalType::LogicalType((LogicalType *)(local_7e8 + 0x18),INTERVAL);
  __l_03._M_len = 2;
  __l_03._M_array = (iterator)local_7e8;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_960,__l_03,(allocator_type *)local_ab8);
  LogicalType::LogicalType(&local_978,INTERVAL);
  local_a58.super__Function_base._M_functor._8_8_ = 0;
  local_a58.super__Function_base._M_functor._M_unused._M_function_pointer =
       ScalarFunction::
       BinaryFunction<long,duckdb::interval_t,duckdb::interval_t,duckdb::MultiplyOperator>;
  local_a58._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_a58.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_888,INVALID);
  varargs_03.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_03._0_8_ = &local_888;
  varargs_03.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffff524;
  varargs_03.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_03.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffff52c;
  ScalarFunction::ScalarFunction
            (&local_580,(vector<duckdb::LogicalType,_true> *)&local_960,&local_978,&local_a58,
             (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,(init_local_state_t)0x0,varargs_03,CONSISTENT,
             in_stack_fffffffffffff538,(bind_lambda_function_t)in_RDI);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_580);
  local_580.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_0247c280;
  if (local_580.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_580.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_580.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_580.function.super__Function_base._M_manager)
              ((_Any_data *)&local_580.function,(_Any_data *)&local_580.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_580.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_888);
  if (local_a58.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_a58.super__Function_base._M_manager)
              ((_Any_data *)&local_a58,(_Any_data *)&local_a58,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_978);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_960);
  lVar4 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(local_7e8 + lVar4));
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  function_00 = (in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
                super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
                super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
                _M_impl.super__Vector_impl_data._M_start;
  pSVar2 = (in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
           super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (function_00 != pSVar2) {
    do {
      BaseScalarFunction::SetReturnsError(&local_e0,&function_00->super_BaseScalarFunction);
      BaseScalarFunction::~BaseScalarFunction(&local_e0);
      function_00 = function_00 + 1;
    } while (function_00 != pSVar2);
  }
  return in_RDI;
}

Assistant:

ScalarFunctionSet OperatorMultiplyFun::GetFunctions() {
	ScalarFunctionSet multiply("*");
	for (auto &type : LogicalType::Numeric()) {
		if (type.id() == LogicalTypeId::DECIMAL) {
			ScalarFunction function({type, type}, type, nullptr, BindDecimalMultiply);
			function.serialize = SerializeDecimalArithmetic;
			function.deserialize = DeserializeDecimalArithmetic<MultiplyOperator, DecimalMultiplyOverflowCheck>;
			multiply.AddFunction(function);
		} else if (TypeIsIntegral(type.InternalType())) {
			multiply.AddFunction(ScalarFunction(
			    {type, type}, type, GetScalarIntegerFunction<MultiplyOperatorOverflowCheck>(type.InternalType()),
			    nullptr, nullptr,
			    PropagateNumericStats<TryMultiplyOperator, MultiplyPropagateStatistics, MultiplyOperator>));
		} else {
			multiply.AddFunction(
			    ScalarFunction({type, type}, type, GetScalarBinaryFunction<MultiplyOperator>(type.InternalType())));
		}
	}
	multiply.AddFunction(
	    ScalarFunction({LogicalType::INTERVAL, LogicalType::DOUBLE}, LogicalType::INTERVAL,
	                   ScalarFunction::BinaryFunction<interval_t, double, interval_t, MultiplyOperator>));
	multiply.AddFunction(
	    ScalarFunction({LogicalType::BIGINT, LogicalType::INTERVAL}, LogicalType::INTERVAL,
	                   ScalarFunction::BinaryFunction<int64_t, interval_t, interval_t, MultiplyOperator>));
	for (auto &func : multiply.functions) {
		ScalarFunction::SetReturnsError(func);
	}

	return multiply;
}